

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

int xmlIsCatastrophicError(int level,int code)

{
  int local_18;
  int fatal;
  int code_local;
  int level_local;
  
  local_18 = 0;
  if (level == 3) {
    if ((code - 1U < 2) || (code == 0x73 || code == 0x74)) {
      local_18 = 1;
    }
    else if ((0x5db < code) && (code < 0x640)) {
      local_18 = 1;
    }
    code_local = local_18;
  }
  else {
    code_local = 0;
  }
  return code_local;
}

Assistant:

int
xmlIsCatastrophicError(int level, int code) {
    int fatal = 0;

    if (level != XML_ERR_FATAL)
        return(0);

    switch (code) {
        case XML_ERR_NO_MEMORY:
        /* case XML_ERR_RESOURCE_LIMIT: */
        case XML_ERR_SYSTEM:
        case XML_ERR_ARGUMENT:
        case XML_ERR_INTERNAL_ERROR:
            fatal = 1;
            break;
        default:
            if ((code >= 1500) && (code <= 1599))
                fatal = 1;
            break;
    }

    return(fatal);
}